

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O0

bool __thiscall
draco::DecoderBuffer::DecodeLeastSignificantBits32
          (DecoderBuffer *this,uint32_t nbits,uint32_t *out_value)

{
  bool bVar1;
  undefined4 in_ESI;
  DecoderBuffer *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = bit_decoder_active(in_RDI);
  if (bVar1) {
    bVar1 = BitDecoder::GetBits((BitDecoder *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                (uint32_t)((ulong)in_RDI >> 0x20),
                                (uint32_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DecodeLeastSignificantBits32(uint32_t nbits, uint32_t *out_value) {
    if (!bit_decoder_active()) {
      return false;
    }
    return bit_decoder_.GetBits(nbits, out_value);
  }